

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O2

fdb_status wal_release_flushed_items(filemgr *file,wal_flush_items *flush_items)

{
  list_elem *e;
  uint32_t uVar1;
  avl_node *node;
  ulong uVar2;
  
  _wal_snap_mark_flushed(file->wal);
  if ((flush_items->tree).aux == (void *)0x1) {
    while( true ) {
      node = avl_first(&flush_items->tree);
      if (node == (avl_node *)0x0) break;
      avl_remove(&flush_items->tree,node);
      uVar1 = get_checksum((uint8_t *)node[-3].left[1].parent,
                           (ulong)*(ushort *)&node[-3].left[1].left);
      uVar2 = (ulong)uVar1 % file->wal->num_shards;
      pthread_spin_lock(&file->wal->key_shards[uVar2].lock);
      _wal_release_items(file,uVar2,(wal_item *)&node[-5].right);
      pthread_spin_unlock(&file->wal->key_shards[uVar2].lock);
    }
  }
  else {
    while (e = (flush_items->list).head, e != (list_elem *)0x0) {
      list_remove(&flush_items->list,e);
      uVar1 = get_checksum((uint8_t *)e[-4].prev[1].next,(ulong)*(ushort *)&e[-4].prev[2].prev);
      uVar2 = (ulong)uVar1 % file->wal->num_shards;
      pthread_spin_lock(&file->wal->key_shards[uVar2].lock);
      _wal_release_items(file,uVar2,(wal_item *)&e[-7].next);
      pthread_spin_unlock(&file->wal->key_shards[uVar2].lock);
    }
  }
  return FDB_RESULT_SUCCESS;
}

Assistant:

fdb_status wal_release_flushed_items(struct filemgr *file,
                                     union wal_flush_items *flush_items)
{
    struct wal_item *item;
    size_t shard_num;

    _wal_snap_mark_flushed(file->wal); // Read-write barrier: items are in trie

    if (_wal_are_items_sorted(flush_items)) {
        struct avl_tree *tree = &flush_items->tree;
        // scan and remove entries in the avl-tree
        while (1) {
            struct avl_node *a;
            if ((a = avl_first(tree)) == NULL) {
                break;
            }
            item = _get_entry(a, struct wal_item, avl_flush);
            avl_remove(tree, &item->avl_flush);

            // Grab the WAL key shard lock.
            shard_num = get_checksum((uint8_t*)item->header->key,
                                     item->header->keylen)
                                     % file->wal->num_shards;
            spin_lock(&file->wal->key_shards[shard_num].lock);

            _wal_release_items(file, shard_num, item);

            spin_unlock(&file->wal->key_shards[shard_num].lock);
        }
    } else {
        struct list *list_head = &flush_items->list;
        // scan and remove entries in the avl-tree
        while (1) {
            struct list_elem *a;
            if ((a = list_begin(list_head)) == NULL) {
                break;
            }
            item = _get_entry(a, struct wal_item, list_elem_flush);
            list_remove(list_head, &item->list_elem_flush);

            // Grab the WAL key shard lock.
            shard_num = get_checksum((uint8_t*)item->header->key,
                                     item->header->keylen)
                                     % file->wal->num_shards;
            spin_lock(&file->wal->key_shards[shard_num].lock);
            _wal_release_items(file, shard_num, item);
            spin_unlock(&file->wal->key_shards[shard_num].lock);
        }
    }

    return FDB_RESULT_SUCCESS;
}